

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O1

int X509_alias_set1(X509 *x,uchar *name,int len)

{
  long lVar1;
  int iVar2;
  ASN1_VALUE *pAVar3;
  ASN1_UTF8STRING *pAVar4;
  stack_st_GENERAL_NAME *psVar5;
  
  if (name == (uchar *)0x0) {
    if (x == (X509 *)0x0) {
      return 1;
    }
    if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
      return 1;
    }
    pAVar4 = *(ASN1_UTF8STRING **)&(x->altname->stack).sorted;
    if (pAVar4 == (ASN1_UTF8STRING *)0x0) {
      return 1;
    }
    ASN1_UTF8STRING_free(pAVar4);
    psVar5 = x->altname;
    (psVar5->stack).sorted = 0;
    (psVar5->stack).num_alloc = 0;
    return 1;
  }
  if (x == (X509 *)0x0) {
LAB_001b6222:
    psVar5 = (stack_st_GENERAL_NAME *)0x0;
  }
  else {
    if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
      pAVar3 = ASN1_item_new((ASN1_ITEM *)&X509_CERT_AUX_it);
      x->altname = (stack_st_GENERAL_NAME *)pAVar3;
      if (pAVar3 == (ASN1_VALUE *)0x0) goto LAB_001b6222;
    }
    psVar5 = x->altname;
  }
  if (psVar5 == (stack_st_GENERAL_NAME *)0x0) {
    return 0;
  }
  lVar1._0_4_ = (psVar5->stack).sorted;
  lVar1._4_4_ = (psVar5->stack).num_alloc;
  if (lVar1 == 0) {
    pAVar4 = ASN1_UTF8STRING_new();
    *(ASN1_UTF8STRING **)&(psVar5->stack).sorted = pAVar4;
    if (pAVar4 == (ASN1_UTF8STRING *)0x0) {
      return 0;
    }
  }
  iVar2 = ASN1_STRING_set(*(ASN1_STRING **)&(psVar5->stack).sorted,name,len);
  return iVar2;
}

Assistant:

int X509_alias_set1(X509 *x, const uint8_t *name, ossl_ssize_t len) {
  X509_CERT_AUX *aux;
  // TODO(davidben): Empty aliases are not meaningful in PKCS#12, and the
  // getters cannot quite represent them. Also erase the object if |len| is
  // zero.
  if (!name) {
    if (!x || !x->aux || !x->aux->alias) {
      return 1;
    }
    ASN1_UTF8STRING_free(x->aux->alias);
    x->aux->alias = NULL;
    return 1;
  }
  if (!(aux = aux_get(x))) {
    return 0;
  }
  if (!aux->alias && !(aux->alias = ASN1_UTF8STRING_new())) {
    return 0;
  }
  return ASN1_STRING_set(aux->alias, name, len);
}